

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_IteratorGetCompleteValue(JSContext *ctx,JSValue obj,BOOL *pdone)

{
  JSValue JVar1;
  int iVar2;
  int iVar3;
  int *in_RCX;
  JSValue JVar4;
  BOOL done;
  JSValue value;
  JSValue done_val;
  undefined1 in_stack_00000078 [16];
  undefined1 in_stack_00000088 [16];
  BOOL in_stack_00000110;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  JSValueUnion in_stack_ffffffffffffff50;
  int64_t in_stack_ffffffffffffff58;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 local_40;
  undefined8 local_38;
  
  JVar4 = JS_GetPropertyInternal
                    ((JSContext *)obj.tag,(JSValue)in_stack_00000088,obj.u._4_4_,
                     (JSValue)in_stack_00000078,in_stack_00000110);
  iVar2 = JS_IsException(JVar4);
  if (iVar2 == 0) {
    JVar4.tag = in_stack_ffffffffffffff58;
    JVar4.u.float64 = in_stack_ffffffffffffff50.float64;
    iVar2 = JS_ToBoolFree((JSContext *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                          ,JVar4);
    JVar4 = JS_GetPropertyInternal
                      ((JSContext *)obj.tag,(JSValue)in_stack_00000088,obj.u._4_4_,
                       (JSValue)in_stack_00000078,in_stack_00000110);
    local_40 = JVar4.u;
    local_38 = JVar4.tag;
    iVar3 = JS_IsException(JVar4);
    if (iVar3 == 0) {
      *in_RCX = iVar2;
      local_70 = (int32_t)local_40;
      uStack_6c = local_40._4_4_;
      local_68 = local_38;
      goto LAB_001667bb;
    }
  }
  *in_RCX = 0;
  local_70 = 0;
  local_68 = 6;
LAB_001667bb:
  JVar1.u._4_4_ = uStack_6c;
  JVar1.u.int32 = local_70;
  JVar1.tag = local_68;
  return JVar1;
}

Assistant:

static JSValue JS_IteratorGetCompleteValue(JSContext *ctx, JSValueConst obj,
                                           BOOL *pdone)
{
    JSValue done_val, value;
    BOOL done;
    done_val = JS_GetProperty(ctx, obj, JS_ATOM_done);
    if (JS_IsException(done_val))
        goto fail;
    done = JS_ToBoolFree(ctx, done_val);
    value = JS_GetProperty(ctx, obj, JS_ATOM_value);
    if (JS_IsException(value))
        goto fail;
    *pdone = done;
    return value;
 fail:
    *pdone = FALSE;
    return JS_EXCEPTION;
}